

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.pb.cc
# Opt level: O3

void __thiscall google::protobuf::Duration::~Duration(Duration *this)

{
  void *pvVar1;
  LogMessage *other;
  LogMessage local_50;
  LogFinisher local_11;
  
  pvVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    pvVar1 = *(void **)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  if (pvVar1 != (void *)0x0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/duration.pb.cc"
               ,0x77);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: GetArena() == nullptr: ");
    internal::LogFinisher::operator=(&local_11,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

Duration::~Duration() {
  // @@protoc_insertion_point(destructor:google.protobuf.Duration)
  SharedDtor();
  _internal_metadata_.Delete<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}